

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OPostDecrement(_Type_CLASS_OBJECT *this,Variable *object)

{
  State *state;
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Variable *in_RDX;
  uint *extraout_RDX;
  Variable VVar3;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Variable v;
  undefined1 local_48 [16];
  pointer local_38;
  pointer *local_30;
  
  pOVar2 = Variable::operator->(in_RDX);
  Class::GetOperator((Class *)&stack0xffffffffffffffd8,
                     (OperatorType)*(undefined8 *)((long)pOVar2->data + 0x38));
  pOVar2 = Variable::operator->((Variable *)&stack0xffffffffffffffd8);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,(Type *)_type_callback);
  if (bVar1) {
    pOVar2 = Variable::operator->(in_RDX);
    if (*(long *)((long)pOVar2->data + 0x40) != 0) {
      pOVar2 = Variable::operator->((Variable *)&stack0xffffffffffffffd8);
      state = (State *)pOVar2->data;
      local_30 = &local_38;
      local_38 = (pointer)((ulong)local_38 & 0xffffffffffffff00);
      Variable::Variable((Variable *)local_48,in_RDX);
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                 (Nullable<LiteScript::Variable> *)local_48);
      if (local_38._0_1_ == false) {
        Variable::~Variable((Variable *)local_48);
      }
      local_48._0_8_ = (Object *)0x0;
      local_48._8_8_ = (pointer)0x0;
      local_38 = (pointer)0x0;
      pOVar2 = Variable::operator->(in_RDX);
      Callback::operator()
                ((Callback *)this,state,
                 *(vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> **)
                  ((long)pOVar2->data + 0x40));
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_48);
      goto LAB_00126396;
    }
  }
  pOVar2 = Variable::operator->(in_RDX);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
LAB_00126396:
  Variable::~Variable((Variable *)&stack0xffffffffffffffd8);
  VVar3.nb_ref = extraout_RDX;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OPostDecrement(Variable& object) const {
    Variable v = object->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_POST_DECR);
    if (v->GetType() == Type::CALLBACK) {
        if (object->GetData<ClassObject>().ScriptState == nullptr)
            return object->memory.Create(Type::NIL);
        Callback &call = v->GetData<Callback>();
        call.This = Nullable<Variable>(object);
        std::vector<Variable> args;
        return call(*(object->GetData<ClassObject>().ScriptState), args);
    }
    else {
        return object->memory.Create(Type::NIL);
    }
}